

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

void __thiscall
Assimp::COBImporter::ReadUnit_Ascii
          (COBImporter *this,Scene *out,LineSplitter *splitter,ChunkInfo *nfo)

{
  byte bVar1;
  _Elt_pointer psVar2;
  element_type *peVar3;
  Logger *pLVar4;
  byte *pbVar5;
  range_error *this_00;
  ulong uVar7;
  _Map_pointer ppsVar8;
  _Elt_pointer psVar9;
  _Elt_pointer psVar10;
  uint t;
  uint local_1bc;
  char *local_1b8;
  char local_1a8 [16];
  undefined1 local_198 [376];
  byte *pbVar6;
  
  if (1 < nfo->version) {
    UnsupportedChunk_Ascii(this,splitter,nfo,"Unit");
    return;
  }
  LineSplitter::operator++(splitter);
  if (((splitter->mCur)._M_string_length < 6) ||
     (pbVar6 = (byte *)(splitter->mCur)._M_dataplus._M_p,
     *(short *)(pbVar6 + 4) != 0x2073 || *(int *)pbVar6 != 0x74696e55)) {
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[39]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
               (char (*) [39])"Expected `Units` line in `Unit` chunk ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar4,local_1b8);
  }
  else {
    psVar10 = (out->nodes).
              super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    psVar2 = (out->nodes).
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar10 != psVar2) {
      psVar9 = (out->nodes).
               super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppsVar8 = (out->nodes).
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        peVar3 = (psVar10->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        if ((peVar3->super_ChunkInfo).id == nfo->parent_id) goto LAB_0047a794;
        psVar10 = psVar10 + 1;
        if (psVar10 == psVar9) {
          psVar10 = ppsVar8[1];
          ppsVar8 = ppsVar8 + 1;
          psVar9 = psVar10 + 0x20;
        }
      } while (psVar10 != psVar2);
    }
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[14]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
               (char (*) [14])0x768cb6);
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," is a child of ",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198," which does not exist",0x15);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar4,local_1b8);
  }
LAB_0047a691:
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return;
LAB_0047a794:
  do {
    do {
      pbVar5 = pbVar6 + 1;
      bVar1 = *pbVar6;
      pbVar6 = pbVar5;
    } while (bVar1 == 9);
  } while (bVar1 == 0x20);
  do {
    uVar7 = (ulong)bVar1;
    if (bVar1 < 0x21) {
      if ((0x100000200U >> (uVar7 & 0x3f) & 1) != 0) break;
      if ((0x3401UL >> (uVar7 & 0x3f) & 1) != 0) {
        this_00 = (range_error *)__cxa_allocate_exception(0x10);
        std::range_error::range_error(this_00,"Token index out of range, EOL reached");
        __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
      }
    }
    bVar1 = *pbVar5;
    pbVar5 = pbVar5 + 1;
  } while( true );
  while (((char)uVar7 == ' ' || ((int)uVar7 == 9))) {
    bVar1 = *pbVar5;
    pbVar5 = pbVar5 + 1;
    uVar7 = (ulong)bVar1;
  }
  local_1bc = 0;
  if (0xf5 < (byte)((char)uVar7 - 0x3aU)) {
    local_1bc = 0;
    do {
      local_1bc = (uint)(byte)((char)uVar7 - 0x30) + local_1bc * 10;
      bVar1 = *pbVar5;
      uVar7 = (ulong)bVar1;
      pbVar5 = pbVar5 + 1;
    } while (0xf5 < (byte)(bVar1 - 0x3a));
    if (7 < local_1bc) {
      pLVar4 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<unsigned_int>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                 &local_1bc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198," is not a valid value for `Units` attribute in `Unit chunk` "
                 ,0x3c);
      std::ostream::_M_insert<unsigned_long>((ulong)local_198);
      std::__cxx11::stringbuf::str();
      Logger::warn(pLVar4,local_1b8);
      ((psVar10->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      unit_scale = 1.0;
      goto LAB_0047a691;
    }
  }
  peVar3->unit_scale = units[local_1bc];
  return;
}

Assistant:

void COBImporter::ReadUnit_Ascii(Scene& out, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 1) {
        return UnsupportedChunk_Ascii(splitter,nfo,"Unit");
    }
    ++splitter;
    if (!splitter.match_start("Units ")) {
        ASSIMP_LOG_WARN_F( "Expected `Units` line in `Unit` chunk ", nfo.id);
        return;
    }

    // parent chunks preceede their childs, so we should have the
    // corresponding chunk already.
    for(std::shared_ptr< Node >& nd : out.nodes) {
        if (nd->id == nfo.parent_id) {
            const unsigned int t=strtoul10(splitter[1]);

            nd->unit_scale = t>=sizeof(units)/sizeof(units[0])?(
                ASSIMP_LOG_WARN_F(t, " is not a valid value for `Units` attribute in `Unit chunk` ", nfo.id)
                ,1.f):units[t];
            return;
        }
    }
    ASSIMP_LOG_WARN_F( "`Unit` chunk ", nfo.id, " is a child of ", nfo.parent_id, " which does not exist");
}